

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchcompute_test.cc
# Opt level: O0

int test_put_job(void)

{
  code *pcVar1;
  char *__s;
  BatchCompute *pBVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_111;
  int ret;
  HttpTestListener *local_f0;
  HttpTestListener *listener;
  string local_e0;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  BatchCompute *local_38;
  BatchCompute *batchcompute;
  undefined1 local_28 [7];
  BatchComputePutJobResponseType resp;
  BatchComputePutJobRequestType req;
  
  aliyun::BatchComputePutJobRequestType::BatchComputePutJobRequestType
            ((BatchComputePutJobRequestType *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"cn-hangzhou",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"my_appid",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"my_secret",&local_b9);
  pBVar2 = (BatchCompute *)
           aliyun::BatchCompute::CreateBatchComputeClient(local_58,local_90,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = pBVar2;
  if (pBVar2 == (BatchCompute *)0x0) {
    aliyun::BatchComputePutJobRequestType::~BatchComputePutJobRequestType
              ((BatchComputePutJobRequestType *)local_28);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::BatchCompute::SetProxyHost(pBVar2,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::BatchCompute::SetUseTls(local_38,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_put_job_response;
  local_f0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_111);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_111);
  HttpTestListener::Start(local_f0);
  std::__cxx11::string::operator=((string *)local_28,"ResourceName");
  aliyun::BatchCompute::PutJob
            ((BatchComputePutJobRequestType *)local_38,(BatchComputePutJobResponseType *)local_28,
             (BatchComputeErrorInfo *)((long)&batchcompute + 7));
  HttpTestListener::WaitComplete(local_f0);
  pHVar3 = local_f0;
  if (local_f0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_f0);
    operator_delete(pHVar3,0x180);
  }
  pBVar2 = local_38;
  if (local_38 != (BatchCompute *)0x0) {
    aliyun::BatchCompute::~BatchCompute(local_38);
    operator_delete(pBVar2,0x30);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_put_job() {
  BatchComputePutJobRequestType req;
  BatchComputePutJobResponseType resp;
  BatchCompute* batchcompute = BatchCompute::CreateBatchComputeClient("cn-hangzhou", "my_appid", "my_secret");
  if(!batchcompute) return 0;
  batchcompute->SetProxyHost("127.0.0.1:12234");
  batchcompute->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_put_job_response);
  listener->Start();
  req.resource_name = "ResourceName";
  int ret = batchcompute->PutJob(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete batchcompute;
}